

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_create(REF_NODE *ref_node_ptr,REF_MPI ref_mpi)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  REF_NODE ref_node;
  REF_INT node;
  REF_INT max;
  REF_MPI ref_mpi_local;
  REF_NODE *ref_node_ptr_local;
  
  pRVar1 = (REF_NODE)malloc(0xa0);
  *ref_node_ptr = pRVar1;
  if (*ref_node_ptr == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x28,
           "ref_node_create","malloc *ref_node_ptr of REF_NODE_STRUCT NULL");
    ref_node_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_node_ptr;
    pRVar1->n = 0;
    pRVar1->max = 0x14;
    pRVar2 = (REF_GLOB *)malloc(0xa0);
    pRVar1->global = pRVar2;
    if (pRVar1->global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x31,
             "ref_node_create","malloc ref_node->global of REF_GLOB NULL");
      ref_node_ptr_local._4_4_ = 2;
    }
    else {
      for (ref_node._0_4_ = 0; (int)ref_node < pRVar1->max; ref_node._0_4_ = (int)ref_node + 1) {
        pRVar1->global[(int)ref_node] = (long)(-2 - ((int)ref_node + 1));
      }
      pRVar1->global[pRVar1->max + -1] = -1;
      pRVar1->blank = -2;
      pRVar2 = (REF_GLOB *)malloc(0xa0);
      pRVar1->sorted_global = pRVar2;
      if (pRVar1->sorted_global == (REF_GLOB *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x38
               ,"ref_node_create","malloc ref_node->sorted_global of REF_GLOB NULL");
        ref_node_ptr_local._4_4_ = 2;
      }
      else {
        pRVar3 = (REF_INT *)malloc(0x50);
        pRVar1->sorted_local = pRVar3;
        if (pRVar1->sorted_local == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x39,"ref_node_create","malloc ref_node->sorted_local of REF_INT NULL");
          ref_node_ptr_local._4_4_ = 2;
        }
        else {
          pRVar3 = (REF_INT *)malloc(0x50);
          pRVar1->part = pRVar3;
          if (pRVar1->part == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x3b,"ref_node_create","malloc ref_node->part of REF_INT NULL");
            ref_node_ptr_local._4_4_ = 2;
          }
          else {
            pRVar3 = (REF_INT *)malloc(0x50);
            pRVar1->age = pRVar3;
            if (pRVar1->age == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x3c,"ref_node_create","malloc ref_node->age of REF_INT NULL");
              ref_node_ptr_local._4_4_ = 2;
            }
            else {
              pRVar4 = (REF_DBL *)malloc(0x960);
              pRVar1->real = pRVar4;
              if (pRVar1->real == (REF_DBL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x3e,"ref_node_create","malloc ref_node->real of REF_DBL NULL");
                ref_node_ptr_local._4_4_ = 2;
              }
              else {
                pRVar1->naux = 0;
                pRVar1->aux = (REF_DBL *)0x0;
                pRVar1->ref_mpi = ref_mpi;
                pRVar1->n_unused = 0;
                pRVar1->max_unused = 10;
                if (pRVar1->max_unused < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x47,"ref_node_create",
                         "malloc ref_node->unused_global of REF_GLOB negative");
                  ref_node_ptr_local._4_4_ = 1;
                }
                else {
                  pRVar2 = (REF_GLOB *)malloc((long)pRVar1->max_unused << 3);
                  pRVar1->unused_global = pRVar2;
                  if (pRVar1->unused_global == (REF_GLOB *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x47,"ref_node_create","malloc ref_node->unused_global of REF_GLOB NULL"
                          );
                    ref_node_ptr_local._4_4_ = 2;
                  }
                  else {
                    pRVar1->old_n_global = -1;
                    pRVar1->new_n_global = -1;
                    pRVar1->min_volume = 1e-15;
                    pRVar1->min_uv_area = 0.0;
                    pRVar1->same_normal_tol = 0.99999999;
                    pRVar1->tet_quality = 2;
                    pRVar1->tri_quality = 2;
                    pRVar1->ratio_method = 1;
                    ref_node_ptr_local._4_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_node_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_create(REF_NODE *ref_node_ptr, REF_MPI ref_mpi) {
  REF_INT max, node;
  REF_NODE ref_node;

  ref_malloc(*ref_node_ptr, 1, REF_NODE_STRUCT);

  ref_node = *ref_node_ptr;

  max = 20;

  ref_node_n(ref_node) = 0;
  ref_node_max(ref_node) = max;

  ref_malloc(ref_node->global, max, REF_GLOB);

  for (node = 0; node < ref_node_max(ref_node); node++)
    ref_node->global[node] = index2next(node + 1);
  ref_node->global[(ref_node->max) - 1] = REF_EMPTY;
  ref_node->blank = index2next(0);

  ref_malloc(ref_node->sorted_global, max, REF_GLOB);
  ref_malloc(ref_node->sorted_local, max, REF_INT);

  ref_malloc(ref_node->part, max, REF_INT);
  ref_malloc(ref_node->age, max, REF_INT);

  ref_malloc(ref_node->real, REF_NODE_REAL_PER * max, REF_DBL);

  ref_node_naux(ref_node) = 0;
  ref_node->aux = NULL;

  ref_node_mpi(ref_node) = ref_mpi; /* reference only */

  ref_node_n_unused(ref_node) = 0;
  ref_node_max_unused(ref_node) = 10;
  ref_malloc(ref_node->unused_global, ref_node_max_unused(ref_node), REF_GLOB);

  ref_node->old_n_global = REF_EMPTY;
  ref_node->new_n_global = REF_EMPTY;

  ref_node->min_volume = 1.0e-15;
  ref_node->min_uv_area = 0.0;
  /* acos(1.0-1.0e-8) ~ 0.0001 radian, 0.01 deg */
  ref_node->same_normal_tol = 1.0 - 1.0e-8;

  ref_node->tet_quality = REF_NODE_JAC_QUALITY;
  ref_node->tri_quality = REF_NODE_JAC_QUALITY;
  ref_node->ratio_method = REF_NODE_RATIO_GEOMETRIC;

  return REF_SUCCESS;
}